

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O1

void lys_compile_unres_depset_erase(ly_ctx *ctx,lys_glob_unres *unres)

{
  ulong uVar1;
  
  ly_set_erase(&(unres->ds_unres).whens,free);
  if ((unres->ds_unres).musts.count != 0) {
    uVar1 = 0;
    do {
      lysc_unres_must_free((lysc_unres_must *)(unres->ds_unres).musts.field_2.dnodes[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (unres->ds_unres).musts.count);
  }
  ly_set_erase(&(unres->ds_unres).musts,(_func_void_void_ptr *)0x0);
  ly_set_erase(&(unres->ds_unres).leafrefs,free);
  if ((unres->ds_unres).dflts.count != 0) {
    uVar1 = 0;
    do {
      lysc_unres_dflt_free(ctx,(lysc_unres_dflt *)(unres->ds_unres).dflts.field_2.dnodes[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (unres->ds_unres).dflts.count);
  }
  ly_set_erase(&(unres->ds_unres).dflts,(_func_void_void_ptr *)0x0);
  ly_set_erase(&(unres->ds_unres).disabled,(_func_void_void_ptr *)0x0);
  ly_set_erase(&(unres->ds_unres).disabled_leafrefs,free);
  ly_set_erase(&(unres->ds_unres).disabled_bitenums,(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

static void
lys_compile_unres_depset_erase(const struct ly_ctx *ctx, struct lys_glob_unres *unres)
{
    uint32_t i;

    ly_set_erase(&unres->ds_unres.whens, free);
    for (i = 0; i < unres->ds_unres.musts.count; ++i) {
        lysc_unres_must_free(unres->ds_unres.musts.objs[i]);
    }
    ly_set_erase(&unres->ds_unres.musts, NULL);
    ly_set_erase(&unres->ds_unres.leafrefs, free);
    for (i = 0; i < unres->ds_unres.dflts.count; ++i) {
        lysc_unres_dflt_free(ctx, unres->ds_unres.dflts.objs[i]);
    }
    ly_set_erase(&unres->ds_unres.dflts, NULL);
    ly_set_erase(&unres->ds_unres.disabled, NULL);
    ly_set_erase(&unres->ds_unres.disabled_leafrefs, free);
    ly_set_erase(&unres->ds_unres.disabled_bitenums, NULL);
}